

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

int __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *C)

{
  uint uVar1;
  char cVar2;
  pointer pcVar3;
  pointer pbVar4;
  pointer pcVar5;
  pointer pAVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Addr *pAVar11;
  uint uVar12;
  size_type *psVar13;
  size_t sVar14;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> D;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_b0,this->N);
  if ((this->RootAddr).FileOff == -1) {
    uVar12 = 0xffffffff;
  }
  else {
    FindNode(this,this->RootAddr,C);
    cVar2 = C->NodeState;
    while (cVar2 != '1') {
      uVar8 = 0;
      if (1 < this->N) {
        uVar8 = 0;
        do {
          if (((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8] != '1') ||
             (iVar7 = std::__cxx11::string::compare((string *)k), iVar7 < 1)) break;
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < (long)this->N + -1);
      }
      uVar9 = uVar8 & 0xffffffff;
      if (((int)uVar8 == this->N + -1) ||
         ((C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] == '0')) {
        lVar10 = uVar9 << 3;
LAB_0012cd5c:
        pAVar11 = (Addr *)((long)&((C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                   super__Vector_impl_data._M_start)->BlockNum + lVar10);
LAB_0012cd60:
        FindNode(this,*pAVar11,C);
      }
      else {
        pbVar4 = (C->k).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar14 = k->_M_string_length;
        if ((sVar14 == pbVar4[uVar9]._M_string_length) &&
           ((sVar14 == 0 ||
            (iVar7 = bcmp((k->_M_dataplus)._M_p,pbVar4[uVar9]._M_dataplus._M_p,sVar14), iVar7 == 0))
           )) {
          FindNode(this,(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9],&local_b0);
          local_110.NodeState = local_b0.NodeState;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_110.k,&local_b0.k);
          local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::_Vector_base<char,_std::allocator<char>_>::_M_create_storage
                    (&local_110.v.super__Vector_base<char,_std::allocator<char>_>,
                     (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
          pcVar3 = local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar14 = (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if (sVar14 != 0) {
            memmove(local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,sVar14);
          }
          local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar3 + sVar14;
          std::vector<Addr,_std::allocator<Addr>_>::vector(&local_110.p,&local_b0.p);
          local_110.parent.BlockNum = local_b0.parent.BlockNum;
          local_110.parent.FileOff = local_b0.parent.FileOff;
          local_110.self.BlockNum = local_b0.self.BlockNum;
          local_110.self.FileOff = local_b0.self.FileOff;
          pcVar5 = (k->_M_dataplus)._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar5,pcVar5 + k->_M_string_length);
          iVar7 = HaveK(this,&local_110,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110.v.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_110.k);
          pAVar6 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (iVar7 == 0) {
            pAVar11 = pAVar6 + uVar9 + 1;
          }
          else {
            pAVar11 = pAVar6 + uVar9;
          }
          goto LAB_0012cd60;
        }
        iVar7 = std::__cxx11::string::compare((string *)k);
        if (iVar7 < 0) {
          lVar10 = uVar9 * 8;
          goto LAB_0012cd5c;
        }
      }
      cVar2 = C->NodeState;
    }
    uVar1 = this->N - 1;
    uVar8 = 0;
    if (1 < this->N) {
      pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      psVar13 = &((C->k).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      uVar8 = 0;
      do {
        if ((pcVar3[uVar8] != '1') ||
           ((sVar14 = k->_M_string_length, sVar14 == *psVar13 &&
            ((sVar14 == 0 ||
             (iVar7 = bcmp((k->_M_dataplus)._M_p,
                           (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (psVar13 + -1))->_M_dataplus)._M_p,sVar14), iVar7 == 0))))))
        goto LAB_0012cf1c;
        uVar8 = uVar8 + 1;
        psVar13 = psVar13 + 4;
      } while (uVar1 != uVar8);
      uVar8 = (ulong)uVar1;
    }
LAB_0012cf1c:
    uVar12 = 0xffffffff;
    if (((uint)uVar8 != uVar1) &&
       (uVar12 = 0xffffffff,
       (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar8 & 0xffffffff] != '0')) {
      uVar12 = (uint)uVar8;
    }
  }
  if (local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.k);
  return uVar12;
}

Assistant:

int BpTree<K>::FindKey(K k, IndexNode<K>& C) {
	IndexNode<K> D(N);
	int i;
	if (this->RootAddr.FileOff == -1)		return -1;	//����ǿ�����ֱ�ӷ���-1
	this->FindNode(this->RootAddr, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			this->FindNode(C.p[i], C);
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if(this->HaveK(D, k))
				this->FindNode(C.p[i], C);			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				this->FindNode(C.p[i + 1], C);		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			this->FindNode(C.p[i], C);
		}
	}
	for (i = 0; i < N - 1 && C.v[i] == '1'&& k != C.k[i]; i++);
	if (i == N - 1 || C.v[i] == '0') {
		return -1;		//δ�ҵ�
	}
	else {
		return i;		//�ҵ���
	}
}